

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall
ClipperLib::Clipper::AddJoin(Clipper *this,TEdge *e1,TEdge *e2,int e1OutIdx,int e2OutIdx)

{
  pointer *pppJVar1;
  iterator __position;
  long64 lVar2;
  JoinRec *jr;
  JoinRec *local_30;
  
  local_30 = (JoinRec *)operator_new(0x50);
  if (e1OutIdx < 0) {
    e1OutIdx = e1->outIdx;
  }
  local_30->poly1Idx = e1OutIdx;
  lVar2 = e1->ycurr;
  (local_30->pt1a).X = e1->xcurr;
  (local_30->pt1a).Y = lVar2;
  lVar2 = e1->ytop;
  (local_30->pt1b).X = e1->xtop;
  (local_30->pt1b).Y = lVar2;
  if (e2OutIdx < 0) {
    e2OutIdx = e2->outIdx;
  }
  local_30->poly2Idx = e2OutIdx;
  lVar2 = e2->ycurr;
  (local_30->pt2a).X = e2->xcurr;
  (local_30->pt2a).Y = lVar2;
  lVar2 = e2->ytop;
  (local_30->pt2b).X = e2->xtop;
  (local_30->pt2b).Y = lVar2;
  __position._M_current =
       (this->m_Joins).
       super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_Joins).
      super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<ClipperLib::JoinRec*,std::allocator<ClipperLib::JoinRec*>>::
    _M_realloc_insert<ClipperLib::JoinRec*const&>
              ((vector<ClipperLib::JoinRec*,std::allocator<ClipperLib::JoinRec*>> *)&this->m_Joins,
               __position,&local_30);
  }
  else {
    *__position._M_current = local_30;
    pppJVar1 = &(this->m_Joins).
                super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppJVar1 = *pppJVar1 + 1;
  }
  return;
}

Assistant:

void Clipper::AddJoin(TEdge *e1, TEdge *e2, int e1OutIdx, int e2OutIdx)
{
  JoinRec* jr = new JoinRec;
  if (e1OutIdx >= 0)
    jr->poly1Idx = e1OutIdx; else
    jr->poly1Idx = e1->outIdx;
  jr->pt1a = IntPoint(e1->xcurr, e1->ycurr);
  jr->pt1b = IntPoint(e1->xtop, e1->ytop);
  if (e2OutIdx >= 0)
    jr->poly2Idx = e2OutIdx; else
    jr->poly2Idx = e2->outIdx;
  jr->pt2a = IntPoint(e2->xcurr, e2->ycurr);
  jr->pt2b = IntPoint(e2->xtop, e2->ytop);
  m_Joins.push_back(jr);
}